

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall
Assimp::ASE::Parser::ParseLV4MeshBonesVertices(Parser *this,uint iNumVertices,Mesh *mesh)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  byte *in;
  int local_54;
  pair<int,_float> pairOut;
  ai_real afVert [3];
  
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
            (&mesh->mBoneVertices,(ulong)iNumVertices);
  local_54 = 0;
LAB_00379bc4:
  do {
    in = (byte *)this->filePtr;
    bVar2 = *in;
    if (bVar2 != 0x2a) {
LAB_00379ca4:
      if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00379ce9;
        this->iLineNumber = this->iLineNumber + 1;
        bVar1 = true;
      }
      else {
        if (bVar2 == 0x7b) {
          local_54 = local_54 + 1;
        }
        else if (bVar2 == 0x7d) {
          local_54 = local_54 + -1;
          if (local_54 == 0) {
            this->filePtr = (char *)(in + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (bVar2 == 0) {
          LogError(this,
                   "Encountered unexpected EOL while parsing a *MESH_BONE_VERTEX chunk (Level 4)");
        }
LAB_00379ce9:
        bVar1 = false;
      }
      this->bLastWasEndLine = bVar1;
      this->filePtr = (char *)(in + 1);
      goto LAB_00379bc4;
    }
    this->filePtr = (char *)(in + 1);
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_VERTEX",0x10);
    in = (byte *)this->filePtr;
    if (!bVar1) {
      bVar2 = *in;
      goto LAB_00379ca4;
    }
    uVar3 = strtoul10((char *)in,&this->filePtr);
    uVar6 = (ulong)uVar3;
    uVar4 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    if (uVar4 <= uVar6) {
      uVar6 = (ulong)((int)uVar4 - 1);
      LogWarning(this,
                 "Bone vertex index is out of bounds. Using the largest valid bone vertex index instead"
                );
    }
    ParseLV4MeshFloatTriple(this,afVert);
    pairOut.first = 0;
    pairOut.second = 0.0;
    while (bVar1 = SkipSpaces<char>(&this->filePtr), bVar1) {
      uVar3 = strtoul10(this->filePtr,&this->filePtr);
      pairOut.first = uVar3;
      bVar1 = SkipSpaces<char>(&this->filePtr);
      if (!bVar1) break;
      pcVar5 = fast_atoreal_move<float>(this->filePtr,&pairOut.second,true);
      this->filePtr = pcVar5;
      if (pairOut.first != -1) {
        std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::push_back
                  (&(mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].mBoneWeights,&pairOut);
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBonesVertices(unsigned int iNumVertices,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBoneVertices.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone vertex
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX" ,16))
            {
                // read the vertex index
                unsigned int iIndex = strtoul10(filePtr,&filePtr);
                if (iIndex >= mesh.mPositions.size())
                {
                    iIndex = (unsigned int)mesh.mPositions.size()-1;
                    LogWarning("Bone vertex index is out of bounds. Using the largest valid "
                        "bone vertex index instead");
                }

                // --- ignored
                ai_real afVert[3];
                ParseLV4MeshFloatTriple(afVert);

                std::pair<int,float> pairOut;
                while (true)
                {
                    // first parse the bone index ...
                    if (!SkipSpaces(&filePtr))break;
                    pairOut.first = strtoul10(filePtr,&filePtr);

                    // then parse the vertex weight
                    if (!SkipSpaces(&filePtr))break;
                    filePtr = fast_atoreal_move<float>(filePtr,pairOut.second);

                    // -1 marks unused entries
                    if (-1 != pairOut.first)
                    {
                        mesh.mBoneVertices[iIndex].mBoneWeights.push_back(pairOut);
                    }
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("4","*MESH_BONE_VERTEX");
    }
    return;
}